

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::TestCaseResultHeader::~TestCaseResultHeader(TestCaseResultHeader *this)

{
  std::__cxx11::string::~string((string *)&this->statusDetails);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestCaseResultHeader	(void) : caseType(TESTCASETYPE_LAST), statusCode(TESTSTATUSCODE_LAST) {}